

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_table_function.cpp
# Opt level: O2

void __thiscall
duckdb::Binder::BindTableInTableOutFunction
          (Binder *this,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *expressions,
          unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
          *subquery)

{
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false> _Var2;
  undefined8 uVar3;
  _Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false> _Var4;
  pointer pSVar5;
  Binder *pBVar6;
  pointer pBVar7;
  type other;
  pointer *__ptr;
  shared_ptr<duckdb::Binder,_true> binder;
  undefined1 local_48 [24];
  _Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false> local_30;
  
  CreateBinder((Binder *)&stack0xffffffffffffffd8,this->context,
               (optional_ptr<duckdb::Binder,_true>)this,REGULAR_BINDER);
  local_48._16_8_ = (ClientContext *)0x0;
  make_uniq<duckdb::SelectNode>();
  pSVar5 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)(local_48 + 8));
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::_M_move_assign(&(pSVar5->select_list).
                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ,expressions);
  make_uniq<duckdb::EmptyTableRef>();
  uVar3 = local_48._0_8_;
  local_48._0_8_ =
       (__uniq_ptr_data<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true,_true>
        )0x0;
  pSVar5 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)(local_48 + 8));
  _Var1._M_head_impl =
       (pSVar5->from_table).
       super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pSVar5->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar3;
  if (_Var1._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
  }
  if ((BoundQueryNode *)local_48._0_8_ != (BoundQueryNode *)0x0) {
    (**(code **)(*(long *)local_48._0_8_ + 8))();
  }
  local_48._16_8_ = local_48._8_8_;
  local_48._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)&stack0xffffffffffffffd8);
  pBVar6->can_contain_nulls = true;
  pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)&stack0xffffffffffffffd8);
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
            ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
             (local_48 + 0x10));
  BindNode((Binder *)local_48,(QueryNode *)pBVar6);
  make_uniq<duckdb::BoundSubqueryRef,duckdb::shared_ptr<duckdb::Binder,true>,duckdb::unique_ptr<duckdb::BoundQueryNode,std::default_delete<duckdb::BoundQueryNode>,true>>
            ((duckdb *)&local_30,(shared_ptr<duckdb::Binder,_true> *)&stack0xffffffffffffffd8,
             (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)local_48);
  _Var4._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (BoundSubqueryRef *)0x0;
  _Var2._M_head_impl =
       (subquery->
       super_unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundSubqueryRef_*,_std::default_delete<duckdb::BoundSubqueryRef>_>
       .super__Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false>._M_head_impl;
  (subquery->
  super_unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>)._M_t.
  super___uniq_ptr_impl<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::BoundSubqueryRef_*,_std::default_delete<duckdb::BoundSubqueryRef>_>
  .super__Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var2._M_head_impl != (BoundSubqueryRef *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BoundTableRef + 8))();
    if (local_30._M_head_impl != (BoundSubqueryRef *)0x0) {
      (*(code *)(*(__node_base_ptr *)local_30._M_head_impl)[1]._M_nxt)();
    }
  }
  pBVar7 = unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
           ::operator->(subquery);
  other = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar7->binder);
  MoveCorrelatedExpressions(this,other);
  if ((BoundQueryNode *)local_48._0_8_ != (BoundQueryNode *)0x0) {
    (**(code **)(*(long *)local_48._0_8_ + 8))();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)local_48._8_8_)[1])();
  }
  if ((ClientContext *)local_48._16_8_ != (ClientContext *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_48._16_8_)->__weak_this_).
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void Binder::BindTableInTableOutFunction(vector<unique_ptr<ParsedExpression>> &expressions,
                                         unique_ptr<BoundSubqueryRef> &subquery) {
	auto binder = Binder::CreateBinder(this->context, this);
	unique_ptr<QueryNode> subquery_node;
	// generate a subquery and bind that (i.e. UNNEST([1,2,3]) becomes UNNEST((SELECT [1,2,3]))
	auto select_node = make_uniq<SelectNode>();
	select_node->select_list = std::move(expressions);
	select_node->from_table = make_uniq<EmptyTableRef>();
	subquery_node = std::move(select_node);
	binder->can_contain_nulls = true;
	auto node = binder->BindNode(*subquery_node);
	subquery = make_uniq<BoundSubqueryRef>(std::move(binder), std::move(node));
	MoveCorrelatedExpressions(*subquery->binder);
}